

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomBuilderCmd.cpp
# Opt level: O1

int cmdline_parser_internal
              (int argc,char **argv,gengetopt_args_info *args_info,cmdline_parser_params *params,
              char *additional_error)

{
  int iVar1;
  cmdline_parser_arg_type arg_type;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  option *poVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  void *pvVar10;
  size_t sVar11;
  char *pcVar12;
  custom_getopt_data *pcVar13;
  long lVar14;
  char **ppcVar15;
  double *pdVar16;
  uint uVar17;
  uint *puVar18;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  undefined8 extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char *extraout_RDX_05;
  char *extraout_RDX_06;
  uint *field_given;
  char *extraout_RDX_07;
  char *extraout_RDX_08;
  char *extraout_RDX_09;
  char *extraout_RDX_10;
  char *extraout_RDX_11;
  char *extraout_RDX_12;
  char *extraout_RDX_13;
  char *extraout_RDX_14;
  char *extraout_RDX_15;
  int iVar19;
  uint uVar20;
  char *__s1;
  custom_getopt_data *pcVar21;
  char *pcVar22;
  char *pcVar23;
  char *pcVar24;
  char **possible_values;
  int iVar25;
  char cVar26;
  option *poVar27;
  ulong uVar28;
  size_t sVar29;
  bool bVar30;
  undefined8 in_stack_fffffffffffffda0;
  char *in_stack_fffffffffffffda8;
  int local_23c;
  option *local_228;
  double *local_210;
  undefined1 local_128 [204];
  uint uStack_5c;
  uint local_58 [2];
  undefined8 uStack_50;
  uint local_48;
  char **local_40;
  uint local_38;
  
  package_name = *argv;
  iVar9 = params->override;
  iVar1 = params->check_required;
  arg_type = params->check_ambiguity;
  if (params->initialize != 0) {
    in_stack_fffffffffffffda0 = 0x12c5c4;
    cmdline_parser_init(args_info);
  }
  pcVar24 = (char *)((long)&uStack_50 + 4);
  local_48 = 0;
  local_58[0] = 0;
  local_58[1] = 0;
  uStack_50 = 0;
  local_128._192_4_ = 0;
  local_128._196_4_ = 0;
  local_128._200_4_ = 0;
  uStack_5c = 0;
  local_128._48_8_ = (char *)0x0;
  local_128._72_8_ = (char *)0x0;
  local_128._96_8_ = (char *)0x0;
  local_128._120_8_ = (char *)0x0;
  local_128._16_8_ = (char *)0x0;
  local_128._24_8_ = (char *)0x0;
  local_128._136_8_ = (double *)0x0;
  local_128._144_8_ = (char **)0x0;
  local_128._168_8_ = (char *)0x0;
  local_128._176_8_ = (char *)0x0;
  local_128._0_8_ = gengetopt_args_info_help[0];
  local_128._8_8_ = gengetopt_args_info_help[1];
  local_128._32_8_ = gengetopt_args_info_help[2];
  local_128._56_8_ = gengetopt_args_info_help[3];
  local_128._80_8_ = gengetopt_args_info_help[4];
  local_128._104_8_ = gengetopt_args_info_help[5];
  local_128._128_8_ = gengetopt_args_info_help[6];
  local_128._160_8_ = gengetopt_args_info_help[7];
  local_128._152_4_ = 0;
  local_128._156_4_ = 0;
  local_128._184_8_ = gengetopt_args_info_help[8];
  local_40 = (char **)0x0;
  local_38 = 0;
  uVar17 = params->print_errors;
  local_210 = (double *)0x0;
  pcVar21 = (custom_getopt_data *)0x0;
  pcVar22 = (char *)(local_128 + 200);
  iVar19 = 0;
  do {
    _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = iVar19;
    pcVar12 = (char *)(ulong)uVar17;
    custom_opterr = uVar17;
    if (argc < 1) {
      uVar28 = 0xffffffff;
LAB_0012cc12:
      local_23c = 0;
    }
    else {
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 = (custom_getopt_data *)0x0;
      if ((_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 == 0) ||
         ((_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_4 & 1) == 0)) {
        if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 == 0) {
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = 1;
        }
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 =
             _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 =
             _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = (custom_getopt_data *)0x0;
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_4 = 1;
      }
      custom_optarg = (char *)pcVar21;
      if ((_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 != (custom_getopt_data *)0x0) &&
         (*(char *)&_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5->custom_optind != '\0')) {
LAB_0012c9af:
        pcVar21 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5;
        iVar19 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
        pcVar22 = (char *)(long)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
        pcVar24 = argv[(long)pcVar22];
        if (pcVar24[1] == '-') {
          for (sVar29 = 0;
              (cVar26 = *(char *)((long)&_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5->
                                         custom_optind + sVar29), cVar26 != '\0' && (cVar26 != '='))
              ; sVar29 = sVar29 + 1) {
          }
          local_23c = -1;
          iVar25 = 0;
          bVar30 = true;
          __s1 = "help";
          bVar4 = false;
          local_228 = (option *)0x0;
          poVar27 = cmdline_parser_internal::long_options;
          do {
            in_stack_fffffffffffffda0 = 0x12ca96;
            pcVar23 = (char *)pcVar21;
            iVar7 = strncmp(__s1,(char *)pcVar21,sVar29);
            iVar8 = local_23c;
            poVar5 = local_228;
            if (iVar7 == 0) {
              in_stack_fffffffffffffda0 = 0x12caa2;
              sVar11 = strlen(__s1);
              iVar8 = iVar25;
              poVar5 = poVar27;
              if ((int)sVar11 == (int)sVar29) break;
              if ((local_228 != (option *)0x0) &&
                 (((local_228->has_arg != poVar27->has_arg || (local_228->flag != poVar27->flag)) ||
                  (iVar8 = local_23c, poVar5 = local_228, local_228->val != poVar27->val)))) {
                bVar4 = true;
                iVar8 = local_23c;
                poVar5 = local_228;
              }
            }
            local_228 = poVar5;
            local_23c = iVar8;
            iVar25 = iVar25 + 1;
            __s1 = poVar27[1].name;
            poVar27 = poVar27 + 1;
            bVar30 = __s1 != (char *)0x0;
            iVar8 = local_23c;
            poVar5 = local_228;
          } while (bVar30);
          local_228 = poVar5;
          local_23c = iVar8;
          if ((bool)(!bVar4 | bVar30)) {
            if (local_228 != (option *)0x0) {
              _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = iVar19 + 1;
              if (*(char *)((long)&pcVar21->custom_optind + sVar29) == '\0') {
                if (local_228->has_arg == 1) {
                  if (argc <= _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0) {
                    if (uVar17 != 0) {
                      pcVar12 = *argv;
                      pcVar22 = "%s: option `%s\' requires an argument\n";
                      goto LAB_0012d0fb;
                    }
                    goto LAB_0012d054;
                  }
                  _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = iVar19 + 2;
                  _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 =
                       (custom_getopt_data *)
                       argv[(long)((long)&((custom_getopt_data *)pcVar22)->custom_optind + 1)];
                }
              }
              else {
                if (local_228->has_arg == 0) {
                  if (uVar17 != 0) {
                    pcVar12 = *argv;
                    if (pcVar24[1] == '-') {
                      pcVar24 = local_228->name;
                      pcVar22 = "%s: option `--%s\' doesn\'t allow an argument\n";
LAB_0012d0fb:
                      fprintf(_stderr,pcVar22,pcVar12,pcVar24);
                    }
                    else {
                      pcVar22 = "%s: option `%c%s\' doesn\'t allow an argument\n";
                      fprintf(_stderr,"%s: option `%c%s\' doesn\'t allow an argument\n",pcVar12,
                              (ulong)(uint)(int)*pcVar24,local_228->name);
                    }
                  }
LAB_0012d054:
                  pcVar21 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5;
                  in_stack_fffffffffffffda0 = 0x12d063;
                  sVar29 = strlen((char *)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5);
                  pcVar12 = extraout_RDX_11;
                  goto LAB_0012cbb9;
                }
                _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 =
                     (custom_getopt_data *)((long)&pcVar21->custom_optind + sVar29 + 1);
              }
              in_stack_fffffffffffffda0 = 0x12ce6e;
              sVar29 = strlen((char *)pcVar21);
              _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 =
                   (custom_getopt_data *)((long)&pcVar21->custom_optind + sVar29);
              uVar28 = (ulong)(uint)local_228->val;
              pcVar24 = extraout_RDX_06;
              if ((uint *)local_228->flag != (uint *)0x0) {
                *local_228->flag = local_228->val;
                uVar28 = 0;
              }
              goto LAB_0012cc14;
            }
            if (uVar17 != 0) {
              pcVar23 = "%s: unrecognized option `--%s\'\n";
              in_stack_fffffffffffffda0 = 0x12d0c3;
              fprintf(_stderr,"%s: unrecognized option `--%s\'\n",*argv,pcVar21);
              pcVar12 = extraout_RDX_13;
            }
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 =
                 _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 + 1;
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = (custom_getopt_data *)0x29fcc3;
          }
          else {
            pcVar22 = pcVar23;
            if (uVar17 != 0) {
              pcVar22 = "%s: option `%s\' is ambiguous\n";
              fprintf(_stderr,"%s: option `%s\' is ambiguous\n",*argv,pcVar24);
            }
            pcVar21 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5;
            in_stack_fffffffffffffda0 = 0x12cbb3;
            sVar29 = strlen((char *)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5);
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 =
                 _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 + 1;
            pcVar12 = extraout_RDX_03;
LAB_0012cbb9:
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 =
                 (custom_getopt_data *)((long)&pcVar21->custom_optind + sVar29);
            pcVar23 = pcVar22;
          }
          uVar28 = 0x3f;
          pcVar24 = pcVar12;
          pcVar22 = pcVar23;
        }
        else {
          pcVar13 = (custom_getopt_data *)
                    ((long)&_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5->custom_optind + 1)
          ;
          cVar26 = *(char *)&_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5->custom_optind;
          uVar20 = (uint)cVar26;
          pcVar22 = (char *)(ulong)uVar20;
          in_stack_fffffffffffffda0 = 0x12ca11;
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = pcVar13;
          pvVar10 = memchr("hVo:l:",uVar20,7);
          if (*(char *)((long)&pcVar21->custom_optind + 1) == '\0') {
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = iVar19 + 1;
          }
          pcVar24 = (char *)CONCAT71((int7)((ulong)extraout_RDX_02 >> 8),
                                     cVar26 == ':' || pvVar10 == (void *)0x0);
          if (cVar26 == ':' || pvVar10 == (void *)0x0) {
            uVar28 = 0x3f;
            if (uVar17 != 0) {
              pcVar22 = "%s: invalid option -- %c\n";
              in_stack_fffffffffffffda0 = 0x12d021;
              fprintf(_stderr,"%s: invalid option -- %c\n",*argv,(ulong)uVar20);
              pcVar24 = extraout_RDX_10;
              goto LAB_0012cc12;
            }
            local_23c = 0;
            goto LAB_0012cc14;
          }
          if (*(char *)((long)pvVar10 + 1) == ':') {
            if (*(char *)((long)pvVar10 + 2) == ':') {
              if (*(char *)&pcVar13->custom_optind == '\0') {
                _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 = (custom_getopt_data *)0x0;
              }
              else {
LAB_0012cbf1:
                _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 =
                     _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 + 1;
                _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 = pcVar13;
              }
            }
            else {
              if (*(char *)&pcVar13->custom_optind != '\0') goto LAB_0012cbf1;
              lVar14 = (long)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
              if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 == argc) {
                cVar26 = '?';
                if (uVar17 != 0) {
                  pcVar22 = "%s: option requires an argument -- %c\n";
                  in_stack_fffffffffffffda0 = 0x12cff9;
                  fprintf(_stderr,"%s: option requires an argument -- %c\n",*argv,(ulong)uVar20);
                  pcVar24 = extraout_RDX_09;
                  cVar26 = '?';
                }
              }
              else {
                _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 =
                     _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 + 1;
                _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 =
                     (custom_getopt_data *)argv[lVar14];
              }
            }
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = (custom_getopt_data *)0x0;
          }
          uVar28 = (ulong)(uint)(int)cVar26;
        }
        goto LAB_0012cc12;
      }
      if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 <
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7) {
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 =
             _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
      }
      if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 <
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6) {
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 =
             _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
      }
      bVar30 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 ==
               _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7;
      pcVar24 = (char *)CONCAT71((int7)((ulong)pcVar24 >> 8),bVar30);
      pcVar22 = (char *)CONCAT71((int7)((ulong)pcVar22 >> 8),
                                 _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 ==
                                 _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 || bVar30);
      if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 ==
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 || bVar30) {
        if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 !=
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0) {
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 =
               _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
        }
      }
      else {
        in_stack_fffffffffffffda0 = 0x12c8ae;
        exchange(argv,(custom_getopt_data *)pcVar22);
        pcVar24 = extraout_RDX;
      }
      iVar19 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
      if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 < argc) {
        ppcVar15 = argv + _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
        do {
          if ((**ppcVar15 == '-') &&
             (iVar19 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0, (*ppcVar15)[1] != '\0')
             ) break;
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 =
               _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 + 1;
          ppcVar15 = ppcVar15 + 1;
          iVar19 = argc;
        } while (argc != _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0);
      }
      iVar25 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
      iVar8 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6;
      iVar7 = iVar19;
      if (iVar19 != argc) {
        pcVar22 = "--";
        in_stack_fffffffffffffda0 = 0;
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 = iVar19;
        iVar6 = strcmp(argv[iVar19],"--");
        pcVar24 = extraout_RDX_00;
        iVar25 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
        iVar8 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6;
        iVar7 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7;
        if ((iVar6 == 0) &&
           (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = iVar19 + 1, iVar25 = argc,
           iVar8 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0, iVar7 = argc,
           _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 != iVar19)) {
          in_stack_fffffffffffffda0 = 0x12c925;
          exchange(argv,(custom_getopt_data *)pcVar22);
          pcVar24 = extraout_RDX_01;
          iVar25 = argc;
          iVar8 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6;
          iVar7 = argc;
        }
      }
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 = iVar7;
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 = iVar8;
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = iVar25;
      if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 == argc) {
        uVar28 = 0xffffffff;
        if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 !=
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7) {
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 =
               _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6;
        }
LAB_0012c9a0:
        bVar30 = false;
      }
      else {
        pcVar21 = (custom_getopt_data *)argv[_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0];
        if (*(char *)&pcVar21->custom_optind != '-') {
LAB_0012c98b:
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 =
               _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 + 1;
          uVar28 = 1;
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 = pcVar21;
          goto LAB_0012c9a0;
        }
        cVar26 = *(char *)((long)&pcVar21->custom_optind + 1);
        pcVar24 = (char *)CONCAT71((int7)((ulong)pcVar24 >> 8),cVar26);
        if (cVar26 == '\0') goto LAB_0012c98b;
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 =
             (custom_getopt_data *)((long)&pcVar21->custom_optind + (ulong)(cVar26 == '-') + 1);
        uVar28 = 0;
        bVar30 = true;
      }
      local_23c = 0;
      if (bVar30) goto LAB_0012c9af;
    }
LAB_0012cc14:
    pcVar21 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3;
    iVar19 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
    uVar17 = custom_opterr;
    custom_optarg = (char *)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3;
    iVar25 = (int)uVar28;
    if (iVar25 < 0x56) {
      if (iVar25 == -1) {
        iVar8 = 3;
      }
      else if (iVar25 == 0) {
        pcVar24 = cmdline_parser_internal::long_options[local_23c].name;
        in_stack_fffffffffffffda0 = 0x12cd43;
        iVar25 = strcmp(pcVar24,"density");
        if (iVar25 == 0) {
          iVar25 = 0x293827;
          pcVar24 = (char *)0x3;
          puVar18 = &uStack_5c;
          field_given = &args_info->density_given;
          pcVar22 = (char *)&args_info->density_orig;
          pdVar16 = &args_info->density_arg;
LAB_0012cecd:
          iVar25 = update_arg(pdVar16,(char **)pcVar22,field_given,puVar18,(char *)pcVar21,
                              (char **)0x0,pcVar24,arg_type,iVar9,0,0,iVar25,(char *)0x2d,
                              (char)in_stack_fffffffffffffda0,in_stack_fffffffffffffda8);
          pcVar24 = extraout_RDX_07;
        }
        else {
          iVar25 = 0x29382f;
          in_stack_fffffffffffffda0 = 0x12cd59;
          iVar8 = strcmp(pcVar24,"nx");
          puVar18 = local_58;
          field_given = &args_info->nx_given;
          pcVar22 = (char *)&args_info->nx_orig;
          pdVar16 = (double *)&args_info->nx_arg;
          if (iVar8 == 0) {
LAB_0012ceb5:
            pcVar24 = (char *)0x2;
            goto LAB_0012cecd;
          }
          iVar25 = 0x293832;
          in_stack_fffffffffffffda0 = 0x12cd73;
          iVar8 = strcmp(pcVar24,"ny");
          puVar18 = local_58 + 1;
          field_given = &args_info->ny_given;
          pcVar22 = (char *)&args_info->ny_orig;
          pdVar16 = (double *)&args_info->ny_arg;
          if (iVar8 == 0) goto LAB_0012ceb5;
          iVar25 = 0x293835;
          in_stack_fffffffffffffda0 = 0x12cd8d;
          iVar8 = strcmp(pcVar24,"nz");
          puVar18 = (uint *)&uStack_50;
          field_given = &args_info->nz_given;
          pcVar22 = (char *)&args_info->nz_orig;
          pdVar16 = (double *)&args_info->nz_arg;
          if (iVar8 == 0) goto LAB_0012ceb5;
          pcVar22 = "molFraction";
          in_stack_fffffffffffffda0 = 0x12cda4;
          iVar25 = strcmp(pcVar24,"molFraction");
          pcVar24 = extraout_RDX_05;
          if (iVar25 != 0) goto LAB_0012cee3;
          pcVar12 = get_multiple_arg_token((char *)pcVar21);
          pcVar13 = pcVar21;
          while( true ) {
            pcVar13 = (custom_getopt_data *)get_multiple_arg_token_next((char *)pcVar13);
            in_stack_fffffffffffffda0 = 0x12cf4b;
            pdVar16 = (double *)malloc(0x18);
            pdVar16[2] = (double)local_210;
            *pdVar16 = 0.0;
            pdVar16[1] = 0.0;
            pcVar22 = (char *)(pdVar16 + 1);
            iVar25 = update_arg(pdVar16,(char **)pcVar22,(uint *)0x0,(uint *)((long)&uStack_50 + 4),
                                pcVar12,(char **)0x0,(char *)0x3,ARG_NO,1,1,1,0x293838,(char *)0x2d,
                                (char)in_stack_fffffffffffffda0,in_stack_fffffffffffffda8);
            pcVar24 = extraout_RDX_08;
            local_210 = pdVar16;
            if (iVar25 != 0) break;
            if (pcVar13 == (custom_getopt_data *)0x0) goto LAB_0012cedd;
            pcVar12 = get_multiple_arg_token((char *)pcVar13);
          }
          if (pcVar12 != (char *)0x0) {
            in_stack_fffffffffffffda0 = 0x12d075;
            free(pcVar12);
            pcVar24 = extraout_RDX_12;
          }
        }
LAB_0012cedd:
        iVar8 = 5;
        if (iVar25 == 0) goto LAB_0012cee3;
      }
      else {
        if (iVar25 != 0x3f) goto LAB_0012d2f6;
        iVar8 = 5;
      }
    }
    else {
      if (iVar25 < 0x6f) {
        if (iVar25 != 0x6c) {
          if (iVar25 == 0x56) {
            cmdline_parser_print_version();
          }
          else {
            if (iVar25 != 0x68) goto LAB_0012d2f6;
            cmdline_parser_print_help();
          }
          cmdline_parser_free((gengetopt_args_info *)local_128);
          exit(0);
        }
        possible_values = cmdline_parser_lattice_values;
        pcVar24 = (char *)0x6c;
        iVar25 = 0x293844;
        pcVar13 = (custom_getopt_data *)&local_48;
        puVar18 = &args_info->lattice_given;
        pcVar22 = (char *)&args_info->lattice_orig;
        ppcVar15 = &args_info->lattice_arg;
      }
      else {
        if (iVar25 != 0x6f) {
LAB_0012d2f6:
          cmdline_parser_internal();
          bVar30 = *(int *)(uVar28 + 200) == 0;
          if (bVar30) {
            fprintf(_stderr,"%s: \'--output\' (\'-o\') option required%s\n",pcVar22,"");
          }
          uVar17 = (uint)bVar30;
          if (*(int *)(uVar28 + 0xcc) == 0) {
            fprintf(_stderr,"%s: \'--density\' option required%s\n",pcVar22,"");
            uVar17 = 1;
          }
          if (*(int *)(uVar28 + 0xd0) == 0) {
            fprintf(_stderr,"%s: \'--nx\' option required%s\n",pcVar22,"");
            uVar17 = 1;
          }
          if (*(int *)(uVar28 + 0xd4) == 0) {
            fprintf(_stderr,"%s: \'--ny\' option required%s\n",pcVar22,"");
            uVar17 = 1;
          }
          if (*(int *)(uVar28 + 0xd8) == 0) {
            fprintf(_stderr,"%s: \'--nz\' option required%s\n",pcVar22,"");
            uVar17 = 1;
          }
          uVar20 = *(uint *)(uVar28 + 0xdc);
          if (uVar20 != 0) {
            uVar2 = *(uint *)(uVar28 + 0x98);
            uVar3 = *(uint *)(uVar28 + 0x9c);
            if (uVar3 == 0 && uVar2 == 0) {
              return uVar17;
            }
            if (uVar2 == 0 || uVar3 == 0) {
              if (uVar2 == 0) {
                if (uVar20 <= uVar3 || uVar3 == 0) {
                  return uVar17;
                }
                pcVar24 = "%s: %s option occurrences must be at most %d\n";
                uVar2 = uVar3;
              }
              else {
                if (uVar2 <= uVar20) {
                  return uVar17;
                }
                pcVar24 = "%s: %s option occurrences must be at least %d\n";
              }
            }
            else {
              if (uVar2 != uVar3) {
                if ((uVar2 <= uVar20) && (uVar20 <= uVar3)) {
                  return uVar17;
                }
                fprintf(_stderr,"%s: %s option occurrences must be between %d and %d\n",pcVar22,
                        "\'--molFraction\'");
                return 1;
              }
              if (uVar20 == uVar2) {
                return uVar17;
              }
              pcVar24 = "%s: %s option occurrences must be %d\n";
            }
            fprintf(_stderr,pcVar24,pcVar22,"\'--molFraction\'",(ulong)uVar2);
            return 1;
          }
          return uVar17;
        }
        possible_values = (char **)0x0;
        pcVar24 = (char *)0x6f;
        iVar25 = 0x293820;
        pcVar13 = (custom_getopt_data *)(local_128 + 200);
        puVar18 = &args_info->output_given;
        pcVar22 = (char *)&args_info->output_orig;
        ppcVar15 = &args_info->output_arg;
      }
      iVar25 = update_arg(ppcVar15,(char **)pcVar22,puVar18,(uint *)pcVar13,
                          (char *)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3,
                          possible_values,(char *)0x1,arg_type,iVar9,0,0,iVar25,pcVar24,
                          (char)in_stack_fffffffffffffda0,in_stack_fffffffffffffda8);
      iVar8 = 5;
      pcVar24 = extraout_RDX_04;
      if (iVar25 != 0) goto LAB_0012cee5;
LAB_0012cee3:
      iVar8 = 0;
    }
LAB_0012cee5:
    if (iVar8 != 0) {
      if (iVar8 == 5) {
        while (local_210 != (double *)0x0) {
          if ((void *)local_210[1] != (void *)0x0) {
            free((void *)local_210[1]);
          }
          pdVar16 = (double *)local_210[2];
          free(local_210);
          local_210 = pdVar16;
        }
        cmdline_parser_release((gengetopt_args_info *)local_128);
        iVar9 = 1;
      }
      else {
        uVar17 = uStack_50._4_4_;
        if (local_210 != (double *)0x0 && uStack_50._4_4_ != 0) {
          uVar20 = args_info->molFraction_given;
          sVar29 = (ulong)(uStack_50._4_4_ + uVar20) << 3;
          ppcVar15 = (char **)realloc(args_info->molFraction_orig,sVar29);
          args_info->molFraction_orig = ppcVar15;
          pdVar16 = (double *)realloc(args_info->molFraction_arg,sVar29);
          args_info->molFraction_arg = pdVar16;
          pcVar24 = extraout_RDX_14;
          if (-1 < (int)(uVar17 - 1)) {
            uVar28 = (ulong)(uVar17 - 1);
            do {
              uVar17 = uVar20 + (int)uVar28;
              args_info->molFraction_arg[uVar17] = *local_210;
              args_info->molFraction_orig[uVar17] = (char *)local_210[1];
              pdVar16 = (double *)local_210[2];
              free(local_210);
              bVar30 = 0 < (long)uVar28;
              pcVar24 = extraout_RDX_15;
              uVar28 = uVar28 - 1;
              local_210 = pdVar16;
            } while (bVar30);
          }
        }
        args_info->molFraction_given = args_info->molFraction_given + uStack_50._4_4_;
        uStack_50 = uStack_50 & 0xffffffff;
        if (iVar1 == 0) {
          cmdline_parser_release((gengetopt_args_info *)local_128);
        }
        else {
          iVar9 = cmdline_parser_required2(args_info,*argv,pcVar24);
          cmdline_parser_release((gengetopt_args_info *)local_128);
          if (iVar9 != 0) {
            return 1;
          }
        }
        iVar9 = 0;
        uVar17 = argc - iVar19;
        if (uVar17 != 0 && iVar19 <= argc) {
          args_info->inputs_num = uVar17;
          ppcVar15 = (char **)malloc((ulong)uVar17 * 8);
          args_info->inputs = ppcVar15;
          iVar9 = 0;
          uVar28 = 0;
          do {
            pcVar22 = gengetopt_strdup(argv[(long)iVar19 + uVar28]);
            args_info->inputs[uVar28] = pcVar22;
            uVar28 = uVar28 + 1;
          } while (uVar17 != uVar28);
        }
      }
      return iVar9;
    }
  } while( true );
}

Assistant:

int
cmdline_parser_internal (
  int argc, char **argv, struct gengetopt_args_info *args_info,
                        struct cmdline_parser_params *params, const char *additional_error)
{
  int c;	/* Character of the parsed option.  */

  struct generic_list * molFraction_list = NULL;
  int error_occurred = 0;
  struct gengetopt_args_info local_args_info;
  
  int override;
  int initialize;
  int check_required;
  int check_ambiguity;

  char *optarg;
  int optind;
  int opterr;
  int optopt;
  
  package_name = argv[0];
  
  override = params->override;
  initialize = params->initialize;
  check_required = params->check_required;
  check_ambiguity = params->check_ambiguity;

  if (initialize)
    cmdline_parser_init (args_info);

  cmdline_parser_init (&local_args_info);

  optarg = 0;
  optind = 0;
  opterr = params->print_errors;
  optopt = '?';

  while (1)
    {
      int option_index = 0;

      static struct option long_options[] = {
        { "help",	0, NULL, 'h' },
        { "version",	0, NULL, 'V' },
        { "output",	1, NULL, 'o' },
        { "density",	1, NULL, 0 },
        { "nx",	1, NULL, 0 },
        { "ny",	1, NULL, 0 },
        { "nz",	1, NULL, 0 },
        { "molFraction",	1, NULL, 0 },
        { "lattice",	1, NULL, 'l' },
        { 0,  0, 0, 0 }
      };

      custom_optarg = optarg;
      custom_optind = optind;
      custom_opterr = opterr;
      custom_optopt = optopt;

      c = custom_getopt_long (argc, argv, "hVo:l:", long_options, &option_index);

      optarg = custom_optarg;
      optind = custom_optind;
      opterr = custom_opterr;
      optopt = custom_optopt;

      if (c == -1) break;	/* Exit from `while (1)' loop.  */

      switch (c)
        {
        case 'h':	/* Print help and exit.  */
          cmdline_parser_print_help ();
          cmdline_parser_free (&local_args_info);
          exit (EXIT_SUCCESS);

        case 'V':	/* Print version and exit.  */
          cmdline_parser_print_version ();
          cmdline_parser_free (&local_args_info);
          exit (EXIT_SUCCESS);

        case 'o':	/* Output file name.  */
        
        
          if (update_arg( (void *)&(args_info->output_arg), 
               &(args_info->output_orig), &(args_info->output_given),
              &(local_args_info.output_given), optarg, 0, 0, ARG_STRING,
              check_ambiguity, override, 0, 0,
              "output", 'o',
              additional_error))
            goto failure;
        
          break;
        case 'l':	/* Lattice Type.  */
        
        
          if (update_arg( (void *)&(args_info->lattice_arg), 
               &(args_info->lattice_orig), &(args_info->lattice_given),
              &(local_args_info.lattice_given), optarg, cmdline_parser_lattice_values, 0, ARG_STRING,
              check_ambiguity, override, 0, 0,
              "lattice", 'l',
              additional_error))
            goto failure;
        
          break;

        case 0:	/* Long option with no short option */
          /* density (g/cm^3).  */
          if (strcmp (long_options[option_index].name, "density") == 0)
          {
          
          
            if (update_arg( (void *)&(args_info->density_arg), 
                 &(args_info->density_orig), &(args_info->density_given),
                &(local_args_info.density_given), optarg, 0, 0, ARG_DOUBLE,
                check_ambiguity, override, 0, 0,
                "density", '-',
                additional_error))
              goto failure;
          
          }
          /* number of unit cells in x.  */
          else if (strcmp (long_options[option_index].name, "nx") == 0)
          {
          
          
            if (update_arg( (void *)&(args_info->nx_arg), 
                 &(args_info->nx_orig), &(args_info->nx_given),
                &(local_args_info.nx_given), optarg, 0, 0, ARG_INT,
                check_ambiguity, override, 0, 0,
                "nx", '-',
                additional_error))
              goto failure;
          
          }
          /* number of unit cells in y.  */
          else if (strcmp (long_options[option_index].name, "ny") == 0)
          {
          
          
            if (update_arg( (void *)&(args_info->ny_arg), 
                 &(args_info->ny_orig), &(args_info->ny_given),
                &(local_args_info.ny_given), optarg, 0, 0, ARG_INT,
                check_ambiguity, override, 0, 0,
                "ny", '-',
                additional_error))
              goto failure;
          
          }
          /* number of unit cells in z.  */
          else if (strcmp (long_options[option_index].name, "nz") == 0)
          {
          
          
            if (update_arg( (void *)&(args_info->nz_arg), 
                 &(args_info->nz_orig), &(args_info->nz_given),
                &(local_args_info.nz_given), optarg, 0, 0, ARG_INT,
                check_ambiguity, override, 0, 0,
                "nz", '-',
                additional_error))
              goto failure;
          
          }
          /* (Default) Builds a multi-component random mixed nanoparticle. Mole Fraction must be specified for each componet > 1 in MD file..  */
          else if (strcmp (long_options[option_index].name, "molFraction") == 0)
          {
          
            if (update_multiple_arg_temp(&molFraction_list, 
                &(local_args_info.molFraction_given), optarg, 0, 0, ARG_DOUBLE,
                "molFraction", '-',
                additional_error))
              goto failure;
          
          }
          
          break;
        case '?':	/* Invalid option.  */
          /* `getopt_long' already printed an error message.  */
          goto failure;

        default:	/* bug: option not considered.  */
          fprintf (stderr, "%s: option unknown: %c%s\n", CMDLINE_PARSER_PACKAGE, c, (additional_error ? additional_error : ""));
          abort ();
        } /* switch */
    } /* while */


  update_multiple_arg((void *)&(args_info->molFraction_arg),
    &(args_info->molFraction_orig), args_info->molFraction_given,
    local_args_info.molFraction_given, 0,
    ARG_DOUBLE, molFraction_list);

  args_info->molFraction_given += local_args_info.molFraction_given;
  local_args_info.molFraction_given = 0;
  
  if (check_required)
    {
      error_occurred += cmdline_parser_required2 (args_info, argv[0], additional_error);
    }

  cmdline_parser_release (&local_args_info);

  if ( error_occurred )
    return (EXIT_FAILURE);

  if (optind < argc)
    {
      int i = 0 ;
      int found_prog_name = 0;
      /* whether program name, i.e., argv[0], is in the remaining args
         (this may happen with some implementations of getopt,
          but surely not with the one included by gengetopt) */


      args_info->inputs_num = argc - optind - found_prog_name;
      args_info->inputs =
        (char **)(malloc ((args_info->inputs_num)*sizeof(char *))) ;
      while (optind < argc)
        args_info->inputs[ i++ ] = gengetopt_strdup (argv[optind++]) ;
    }

  return 0;

failure:
  free_list (molFraction_list, 0 );
  
  cmdline_parser_release (&local_args_info);
  return (EXIT_FAILURE);
}